

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O3

bool __thiscall
Inferences::FunctionDefinitionDemodulation::perform
          (FunctionDefinitionDemodulation *this,Clause *cl,Clause **replacement,
          ClauseIterator *premises)

{
  long *plVar1;
  int *piVar2;
  Ordering *pOVar3;
  ulong uVar4;
  Term *term;
  Clause *eqClause;
  Literal *eqLit;
  ResultSubstitution *pRVar5;
  RefCounter *pRVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  void **head_1;
  TermList rwTerm;
  DemodulationHelper *helper;
  TermList TVar10;
  Clause *pCVar11;
  ulong uVar12;
  ulong uVar13;
  void **head;
  TypedTermList t;
  bool isEqTautology;
  Clause *local_148;
  VirtualIterator<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
  git;
  QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause> qr;
  ResultSubstitutionSP local_c0;
  NonVariableNonTypeIterator local_b0;
  SimplifyingInference2 local_78;
  long *local_60 [6];
  
  pOVar3 = (((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->_ordering)._obj
  ;
  if (perform(Kernel::Clause*,Kernel::Clause*&,Lib::VirtualIterator<Kernel::Clause*>&)::attempted ==
      '\0') {
    perform();
  }
  Lib::DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::reset
            (&perform::attempted._map);
  uVar4 = *(ulong *)&cl->field_0x38;
  if ((uVar4 & 0xfffff) == 0) {
    bVar7 = false;
  }
  else {
    uVar13 = 0;
    local_148 = cl;
    do {
      term = &cl->_literals[uVar13]->super_Term;
      bVar7 = false;
      Kernel::NonVariableNonTypeIterator::NonVariableNonTypeIterator(&local_b0,term,false);
      if (local_b0._stack._cursor != local_b0._stack._stack) {
        do {
          rwTerm._content = (uint64_t)Kernel::NonVariableNonTypeIterator::next(&local_b0);
          Kernel::SortHelper::getResultSort((Term *)rwTerm._content);
          bVar7 = Lib::DHMap<Kernel::Term_*,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                  ::insert(&perform::attempted._map,rwTerm._content);
          if (bVar7) {
            bVar7 = DemodulationHelper::redundancyCheckNeededForPremise
                              (&this->_helper,local_148,(Literal *)term,rwTerm);
            t._sort._content = rwTerm._content;
            t.super_TermList._content =
                 (uint64_t)
                 ((this->super_ForwardSimplificationEngine).super_InferenceEngine._salg)->
                 _fnDefHandler;
            Shell::FunctionDefinitionHandler::getGeneralizations
                      ((FunctionDefinitionHandler *)&git,t);
            helper = (DemodulationHelper *)0x0;
            if (bVar7) {
              helper = &this->_helper;
            }
            do {
              iVar8 = (*(git._core)->_vptr_IteratorCore[2])();
              if ((char)iVar8 == '\0') {
                iVar8 = 0;
                break;
              }
              (*(git._core)->_vptr_IteratorCore[3])(&qr);
              iVar8 = 7;
              if ((*(uint *)&(qr.data)->clause->field_0x38 & 0xfffff) == 1) {
                TVar10 = Kernel::EqHelper::getOtherEqualitySide
                                   ((qr.data)->literal,((qr.data)->term).super_TermList._content);
                uVar9 = (*pOVar3->_vptr_Ordering[3])
                                  (pOVar3,TVar10._content,((qr.data)->term).super_TermList._content)
                ;
                pRVar6 = qr.unifier._refCnt;
                pRVar5 = qr.unifier._obj;
                pCVar11 = local_148;
                if ((uVar9 & 0xfffffffd) != 1) {
                  isEqTautology = false;
                  eqClause = (qr.data)->clause;
                  TVar10._content = ((qr.data)->term).super_TermList._content;
                  eqLit = (qr.data)->literal;
                  local_c0._obj = qr.unifier._obj;
                  local_c0._refCnt = qr.unifier._refCnt;
                  if (qr.unifier._refCnt != (RefCounter *)0x0 &&
                      qr.unifier._obj != (ResultSubstitution *)0x0) {
                    (qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + 1;
                  }
                  local_78.rule = FUNCTION_DEFINITION_DEMODULATION;
                  local_78.premise1 = local_148;
                  local_78.premise2 = eqClause;
                  Kernel::Inference::Inference((Inference *)local_60,&local_78);
                  pCVar11 = performRewriting(pCVar11,(Literal *)term,rwTerm,eqClause,eqLit,TVar10,
                                             &local_c0,helper,&isEqTautology,(Inference *)local_60);
                  if ((pRVar5 != (ResultSubstitution *)0x0 && pRVar6 != (RefCounter *)0x0) &&
                     (pRVar6->_val = pRVar6->_val + -1, pRVar6->_val == 0)) {
                    (*pRVar5->_vptr_ResultSubstitution[1])(pRVar5);
                    *(undefined8 *)pRVar6 = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                    Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pRVar6;
                  }
                  if (pCVar11 == (Clause *)0x0) {
                    iVar8 = 7;
                    if ((isEqTautology & 1U) == 0) goto LAB_004cdc5b;
                  }
                  else if ((isEqTautology & 1U) == 0) {
                    *replacement = pCVar11;
                  }
                  pCVar11 = (qr.data)->clause;
                  local_60[0] = (long *)Lib::FixedSizeAllocator<32UL>::alloc
                                                  ((FixedSizeAllocator<32UL> *)
                                                   (Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
                  *local_60[0] = (long)&PTR__IteratorCore_00b37428;
                  *(undefined1 *)(local_60[0] + 2) = 0;
                  local_60[0][3] = (long)pCVar11;
                  *(undefined4 *)(local_60[0] + 1) = 1;
                  Lib::VirtualIterator<Kernel::Clause_*>::operator=
                            (premises,(VirtualIterator<Kernel::Clause_*> *)local_60);
                  if (local_60[0] != (long *)0x0) {
                    plVar1 = local_60[0] + 1;
                    *(int *)plVar1 = (int)*plVar1 + -1;
                    if ((int)*plVar1 == 0) {
                      (**(code **)(*local_60[0] + 8))();
                    }
                  }
                  iVar8 = 1;
                }
              }
LAB_004cdc5b:
              if ((((qr.unifier._obj != (ResultSubstitution *)0x0) &&
                   (qr.unifier._refCnt != (RefCounter *)0x0)) &&
                  ((qr.unifier._refCnt)->_val = (qr.unifier._refCnt)->_val + -1,
                  (qr.unifier._refCnt)->_val == 0)) &&
                 ((*(qr.unifier._obj)->_vptr_ResultSubstitution[1])(),
                 qr.unifier._refCnt != (RefCounter *)0x0)) {
                *(undefined8 *)qr.unifier._refCnt = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
                Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = qr.unifier._refCnt;
              }
            } while (iVar8 == 7);
            if (git._core !=
                (IteratorCore<Indexing::QueryRes<Lib::SmartPtr<Indexing::ResultSubstitution>,_Indexing::TermLiteralClause>_>
                 *)0x0) {
              piVar2 = &(git._core)->_refCnt;
              *piVar2 = *piVar2 + -1;
              if (*piVar2 == 0) {
                (*(git._core)->_vptr_IteratorCore[1])();
              }
            }
            if ((iVar8 != 5) && (bVar7 = iVar8 != 0, cl = local_148, bVar7)) goto LAB_004cdcf9;
          }
          else {
            Kernel::NonVariableNonTypeIterator::right(&local_b0);
          }
        } while (local_b0._stack._cursor != local_b0._stack._stack);
        bVar7 = false;
        cl = local_148;
      }
LAB_004cdcf9:
      local_b0.super_IteratorCore<Kernel::Term_*>._vptr_IteratorCore =
           (_func_int **)&PTR__NonVariableNonTypeIterator_00b3db90;
      if (local_b0._stack._stack != (Term **)0x0) {
        uVar12 = local_b0._stack._capacity * 8 + 0xf & 0xfffffffffffffff0;
        if (uVar12 == 0) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_b0._stack._stack;
        }
        else if (uVar12 < 0x11) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_b0._stack._stack;
        }
        else if (uVar12 < 0x19) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_b0._stack._stack;
        }
        else if (uVar12 < 0x21) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_b0._stack._stack;
        }
        else if (uVar12 < 0x31) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_b0._stack._stack;
        }
        else if (uVar12 < 0x41) {
          *local_b0._stack._stack = (Term *)Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
          Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_b0._stack._stack;
        }
        else {
          operator_delete(local_b0._stack._stack,0x10);
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != ((uint)uVar4 & 0xfffff) && bVar7 == false);
  }
  return bVar7;
}

Assistant:

bool FunctionDefinitionDemodulation::perform(Clause* cl, Clause*& replacement, ClauseIterator& premises)
{
  Ordering& ordering = _salg->getOrdering();

  static DHSet<Term*> attempted;
  attempted.reset();

  unsigned cLen = cl->length();
  for (unsigned li = 0; li < cLen; li++) {
    Literal* lit = (*cl)[li];
    NonVariableNonTypeIterator it(lit);
    while (it.hasNext()) {
      TypedTermList trm = it.next();
      if (!attempted.insert(trm.term())) {
        it.right();
        continue;
      }

      bool redundancyCheck = _helper.redundancyCheckNeededForPremise(cl, lit, trm);

      auto git = _salg->getFunctionDefinitionHandler().getGeneralizations(trm);
      while (git.hasNext()) {
        auto qr = git.next();
        if (qr.data->clause->length() != 1) {
          continue;
        }
        auto rhs = EqHelper::getOtherEqualitySide(qr.data->literal, qr.data->term);
        // TODO shouldn't allow demodulation with incomparables in the non-ground case
        if (Ordering::isGreaterOrEqual(ordering.compare(rhs,qr.data->term))) {
          continue;
        }
        bool isEqTautology = false;
        auto res = performRewriting(
          cl, lit, trm, qr.data->clause, qr.data->literal, qr.data->term, qr.unifier, redundancyCheck ? &_helper : nullptr,
          isEqTautology, Inference(SimplifyingInference2(InferenceRule::FUNCTION_DEFINITION_DEMODULATION, cl, qr.data->clause)));
        if (!res && !isEqTautology) {
          continue;
        }
        if (!isEqTautology) {
          replacement = res;
        }
        premises = pvi(getSingletonIterator(qr.data->clause));
        return true;
      }
    }
  }

  return false;
}